

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::BoundaryApproxIntersects(S2Loop *this,Iterator *it,S2Cell *target)

{
  int i;
  bool bVar1;
  bool bVar2;
  const_reference pvVar3;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar4;
  S2Point *a_xyz;
  S2Point *b_xyz;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  R2Point v1;
  R2Rect bound;
  R2Point v0;
  R2Point local_98;
  R2Rect local_88;
  R2Rect local_68;
  S2LogMessage local_40;
  
  local_88.bounds_[0].bounds_.c_[0] = (VType)(it->super_IteratorBase).id_.id_;
  bVar1 = S2CellId::contains((S2CellId *)&local_88,(S2CellId)(target->id_).id_);
  if (!bVar1) {
    S2LogMessage::S2LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.cc"
               ,0x1e5,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_40.stream_,"Check failed: it.id().contains(target.id()) ",0x2c);
    if (!bVar1) {
      abort();
    }
  }
  bVar1 = false;
  pvVar3 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                     ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
                      (it->super_IteratorBase).cell_._M_b._M_p,0);
  if ((1 < *(uint *)&pvVar3->field_0x4) &&
     (bVar1 = true, (it->super_IteratorBase).id_.id_ != (target->id_).id_)) {
    uVar7 = *(uint *)&pvVar3->field_0x4 >> 1;
    if (BoundaryApproxIntersects(MutableS2ShapeIndex::Iterator_const&,S2Cell_const&)::kMaxError ==
        '\0') {
      BoundaryApproxIntersects();
    }
    local_68.bounds_[0].bounds_.c_[0] = (target->uv_).bounds_[0].bounds_.c_[0];
    local_68.bounds_[0].bounds_.c_[1] = (target->uv_).bounds_[0].bounds_.c_[1];
    local_68.bounds_[1].bounds_.c_[0] = (target->uv_).bounds_[1].bounds_.c_[0];
    local_68.bounds_[1].bounds_.c_[1] = (target->uv_).bounds_[1].bounds_.c_[1];
    local_98.c_[0] = BoundaryApproxIntersects::kMaxError;
    local_98.c_[1] = BoundaryApproxIntersects::kMaxError;
    R2Rect::Expanded(&local_88,&local_68,&local_98);
    bVar1 = true;
    uVar6 = 1;
    lVar5 = 0;
    do {
      paVar4 = &pvVar3->field_3;
      if (5 < *(uint *)&pvVar3->field_0x4) {
        paVar4 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar3->field_3).edges_;
      }
      i = *(int *)((long)paVar4 + lVar5);
      local_68.bounds_[0].bounds_.c_[0] = 0.0;
      local_68.bounds_[0].bounds_.c_[1] = 0.0;
      local_98.c_[0] = 0.0;
      local_98.c_[1] = 0.0;
      a_xyz = vertex(this,i);
      b_xyz = vertex(this,i + 1);
      bVar2 = S2::ClipToPaddedFace
                        (a_xyz,b_xyz,(int)target->face_,BoundaryApproxIntersects::kMaxError,
                         (R2Point *)&local_68,&local_98);
      if ((bVar2) && (bVar2 = S2::IntersectsRect((R2Point *)&local_68,&local_98,&local_88), bVar2))
      {
        return bVar1;
      }
      bVar1 = uVar6 < uVar7;
      lVar5 = lVar5 + 4;
      uVar6 = uVar6 + 1;
    } while ((ulong)(uVar7 + (uVar7 == 0)) << 2 != lVar5);
  }
  return bVar1;
}

Assistant:

bool S2Loop::BoundaryApproxIntersects(const MutableS2ShapeIndex::Iterator& it,
                                      const S2Cell& target) const {
  S2_DCHECK(it.id().contains(target.id()));
  const S2ClippedShape& a_clipped = it.cell().clipped(0);
  int a_num_edges = a_clipped.num_edges();

  // If there are no edges, there is no intersection.
  if (a_num_edges == 0) return false;

  // We can save some work if "target" is the index cell itself.
  if (it.id() == target.id()) return true;

  // Otherwise check whether any of the edges intersect "target".
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  for (int i = 0; i < a_num_edges; ++i) {
    int ai = a_clipped.edge(i);
    R2Point v0, v1;
    if (S2::ClipToPaddedFace(vertex(ai), vertex(ai+1), target.face(),
                             kMaxError, &v0, &v1) &&
        S2::IntersectsRect(v0, v1, bound)) {
      return true;
    }
  }
  return false;
}